

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void acquireMonitor(_GLFWwindow *window)

{
  int ypos;
  int xpos;
  GLFWvidmode mode;
  int local_48;
  int local_44;
  GLFWvidmode local_40;
  
  if (_glfw.x11.saver.count == 0) {
    (*_glfw.x11.xlib.GetScreenSaver)
              (_glfw.x11.display,(int *)0x197774,(int *)0x197778,(int *)0x19777c,(int *)0x197780);
    (*_glfw.x11.xlib.SetScreenSaver)(_glfw.x11.display,0,0,0,2);
  }
  if (window->monitor->window == (_GLFWwindow *)0x0) {
    _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  }
  _glfwSetVideoModeX11(window->monitor,&window->videoMode);
  if ((window->x11).overrideRedirect != 0) {
    _glfwGetMonitorPosX11(window->monitor,&local_44,&local_48);
    _glfwGetVideoModeX11(window->monitor,&local_40);
    (*_glfw.x11.xlib.MoveResizeWindow)
              (_glfw.x11.display,(window->x11).handle,local_44,local_48,local_40.width,
               local_40.height);
  }
  _glfwInputMonitorWindow(window->monitor,window);
  return;
}

Assistant:

static void acquireMonitor(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwGetMonitorPosX11(window->monitor, &xpos, &ypos);
        _glfwGetVideoModeX11(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindow(window->monitor, window);
}